

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O0

void * google::anon_unknown_0::GetPC(void *ucontext_in_void)

{
  ucontext_t *context;
  void *ucontext_in_void_local;
  
  if (ucontext_in_void == (void *)0x0) {
    ucontext_in_void_local = (void *)0x0;
  }
  else {
    ucontext_in_void_local = *(void **)((long)ucontext_in_void + 0xa8);
  }
  return ucontext_in_void_local;
}

Assistant:

void* GetPC(void* ucontext_in_void) {
#  if (defined(HAVE_UCONTEXT_H) || defined(HAVE_SYS_UCONTEXT_H)) && \
      defined(PC_FROM_UCONTEXT)
  if (ucontext_in_void != nullptr) {
    ucontext_t* context = reinterpret_cast<ucontext_t*>(ucontext_in_void);
    return (void*)context->PC_FROM_UCONTEXT;
  }
#  else
  (void)ucontext_in_void;
#  endif
  return nullptr;
}